

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.cpp
# Opt level: O2

void __thiscall r_exec::Group::delete_view(Group *this,const_iterator *v)

{
  long *plVar1;
  char cVar2;
  byte bVar3;
  iterator iVar4;
  long lVar5;
  
  cVar2 = (**(code **)(**(long **)((long)&(((v->
                                            super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                            )._M_cur)->
                                          super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                          ).
                                          super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                          ._M_storage._M_storage + 8) + 0x10))();
  lVar5 = 0x308;
  if (cVar2 == '\0') {
    plVar1 = *(long **)(*(long *)((long)&(((v->
                                           super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                           )._M_cur)->
                                         super__Hash_node_value<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                                         ).
                                         super__Hash_node_value_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>
                                         ._M_storage._M_storage + 8) + 0x20);
    (**(code **)(*plVar1 + 0x20))(plVar1,0);
    cVar2 = r_code::Atom::getDescriptor();
    bVar3 = cVar2 + 0x3d;
    if (0xc < bVar3) {
      return;
    }
    if ((0x1fe3U >> (bVar3 & 0x1f) & 1) == 0) {
      return;
    }
    lVar5 = *(long *)(&DAT_001aba78 + (ulong)bVar3 * 8);
  }
  iVar4 = std::
          _Hashtable<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::erase((_Hashtable<unsigned_long,_std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_std::allocator<std::pair<const_unsigned_long,_core::P<r_exec::View>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)((long)&(this->super_LObject).super_Object<r_code::LObject,_r_exec::LObject>.
                             super_LObject.super_Code.super__Object._vptr__Object + lVar5),
                  (const_iterator)
                  (v->
                  super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>
                  )._M_cur);
  (v->super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>).
  _M_cur = (__node_type *)
           iVar4.
           super__Node_iterator_base<std::pair<const_unsigned_long,_core::P<r_exec::View>_>,_false>.
           _M_cur;
  return;
}

Assistant:

void Group::delete_view(std::unordered_map<uint64_t, P<View> >::const_iterator &v)
{
    if (v->second->isNotification()) {
        v = notification_views.erase(v);
    } else switch (v->second->object->code(0).getDescriptor()) {
        case Atom::NULL_PROGRAM:
        case Atom::INSTANTIATED_PROGRAM:
        case Atom::INSTANTIATED_CPP_PROGRAM:
        case Atom::COMPOSITE_STATE:
        case Atom::MODEL:
            v = ipgm_views.erase(v);
            break;

        case Atom::INSTANTIATED_ANTI_PROGRAM:
            v = anti_ipgm_views.erase(v);
            break;

        case Atom::INSTANTIATED_INPUT_LESS_PROGRAM:
            v = input_less_ipgm_views.erase(v);
            break;

        case Atom::OBJECT:
        case Atom::MARKER:
            v = other_views.erase(v);
            break;

        case Atom::GROUP:
            v = group_views.erase(v);
            break;
        }
}